

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O3

Client * __thiscall
capnp::Orphan<capnp::DynamicCapability>::getReader
          (Client *__return_storage_ptr__,Orphan<capnp::DynamicCapability> *this)

{
  RawBrandedSchema *pRVar1;
  word local_28;
  SegmentBuilder *pSStack_20;
  
  pRVar1 = (this->schema).super_Schema.raw;
  capnp::_::OrphanBuilder::asCapability((OrphanBuilder *)&local_28);
  (__return_storage_ptr__->super_Client).hook.disposer = (Disposer *)local_28.content;
  (__return_storage_ptr__->super_Client).hook.ptr = (ClientHook *)pSStack_20;
  (__return_storage_ptr__->schema).super_Schema.raw = pRVar1;
  return __return_storage_ptr__;
}

Assistant:

DynamicCapability::Client Orphan<DynamicCapability>::getReader() const {
  return DynamicCapability::Client(schema, builder.asCapability());
}